

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  byte *s_00;
  byte *pbVar9;
  bool bVar10;
  char *local_48;
  
  do {
    while (bVar1 = *p, bVar1 == 0x25) {
      bVar1 = ((byte *)p)[1];
      if ((ulong)bVar1 == 0x66) {
        if (((byte *)p)[2] != 0x5b) {
          luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
        }
        pbVar9 = (byte *)p + 2;
        p = classend(ms,(char *)pbVar9);
        if (s == ms->src_init) {
          uVar4 = 0;
        }
        else {
          uVar4 = (uint)((byte *)s)[-1];
        }
        iVar3 = matchbracketclass(uVar4,(char *)pbVar9,(char *)((byte *)p + -1));
        bVar10 = true;
        if ((iVar3 == 0) &&
           (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar9,(char *)((byte *)p + -1)),
           iVar3 != 0)) {
          bVar10 = false;
        }
        else {
          local_48 = (char *)0x0;
          p = (char *)pbVar9;
        }
        if (bVar10) {
          return local_48;
        }
      }
      else if (bVar1 == 0x62) {
        if ((((byte *)p)[2] == 0) || (((byte *)p)[3] == 0)) {
          luaL_error(ms->L,"unbalanced pattern");
        }
        if (*s == ((byte *)p)[2]) {
          pbVar9 = (byte *)s + 1;
          if (pbVar9 < ms->src_end) {
            iVar3 = 1;
            do {
              if (*pbVar9 == ((byte *)p)[3]) {
                iVar3 = iVar3 + -1;
                if (iVar3 == 0) {
                  s = (char *)(pbVar9 + 1);
                  goto LAB_00117bb3;
                }
              }
              else {
                iVar3 = iVar3 + (uint)(*pbVar9 == ((byte *)p)[2]);
              }
              pbVar9 = pbVar9 + 1;
            } while (pbVar9 != (byte *)ms->src_end);
          }
        }
        s = (char *)0x0;
LAB_00117bb3:
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 4);
      }
      else {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 8) == 0) goto LAB_00117bd9;
        if (((bVar1 < 0x31) || (uVar4 = bVar1 - 0x31, ms->level <= (int)uVar4)) ||
           (ms->capture[uVar4].len == -1)) {
          uVar4 = luaL_error(ms->L,"invalid capture index");
        }
        uVar7 = ms->capture[(int)uVar4].len;
        if ((ulong)((long)ms->src_end - (long)s) < uVar7) {
          s = (char *)0x0;
        }
        else {
          iVar3 = bcmp(ms->capture[(int)uVar4].init,s,uVar7);
          s = (char *)((byte *)s + uVar7);
          if (iVar3 != 0) {
            s = (char *)0x0;
          }
        }
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 2);
      }
    }
    if (bVar1 < 0x28) {
      if (bVar1 == 0) {
        return (char *)(byte *)s;
      }
      if ((bVar1 == 0x24) && (((byte *)p)[1] == 0)) {
        if (s == ms->src_end) {
          return (char *)(byte *)s;
        }
        return (char *)0x0;
      }
    }
    else {
      if (bVar1 == 0x29) {
        uVar7 = (ulong)(uint)ms->level;
        ppVar8 = &ms->capture[uVar7 - 1].len;
        break;
      }
      if (bVar1 == 0x28) {
        if (((byte *)p)[1] == 0x29) {
          pbVar9 = (byte *)p + 2;
          iVar3 = -2;
        }
        else {
          pbVar9 = (byte *)p + 1;
          iVar3 = -1;
        }
        pcVar6 = start_capture(ms,s,(char *)pbVar9,iVar3);
        return pcVar6;
      }
    }
LAB_00117bd9:
    pbVar9 = (byte *)classend(ms,p);
    if (s < ms->src_end) {
      iVar3 = singlematch((uint)(byte)*s,p,(char *)pbVar9);
      bVar10 = iVar3 != 0;
    }
    else {
      bVar10 = false;
    }
    bVar1 = *pbVar9;
    if (bVar1 < 0x2d) {
      if (bVar1 == 0x2a) {
        local_48 = max_expand(ms,s,p,(char *)pbVar9);
LAB_00117cce:
        bVar10 = true;
      }
      else {
        if (bVar1 == 0x2b) {
          if (bVar10) {
            pcVar6 = max_expand(ms,(char *)((byte *)s + 1),p,(char *)pbVar9);
            goto LAB_00117cf2;
          }
        }
        else {
LAB_00117ca9:
          if (bVar10) {
            s = (char *)((byte *)s + 1);
            goto LAB_00117d45;
          }
        }
        bVar10 = true;
        local_48 = (char *)0x0;
      }
    }
    else {
      if (bVar1 != 0x3f) {
        if (bVar1 != 0x2d) goto LAB_00117ca9;
        s_00 = (byte *)s;
        do {
          pcVar6 = match(ms,(char *)s_00,(char *)(pbVar9 + 1));
          if (pcVar6 == (char *)0x0) {
            if ((s_00 < ms->src_end) &&
               (iVar3 = singlematch((uint)*s_00,p,(char *)pbVar9), iVar3 != 0)) {
              s_00 = s_00 + 1;
              bVar10 = true;
            }
            else {
              local_48 = (char *)0x0;
              bVar10 = false;
            }
          }
          else {
            bVar10 = false;
            local_48 = pcVar6;
          }
        } while (bVar10);
        goto LAB_00117cce;
      }
      if ((bVar10) &&
         (pcVar6 = match(ms,(char *)((byte *)s + 1),(char *)(pbVar9 + 1)), pcVar6 != (char *)0x0)) {
LAB_00117cf2:
        bVar10 = true;
        local_48 = pcVar6;
      }
      else {
        pbVar9 = pbVar9 + 1;
LAB_00117d45:
        bVar10 = false;
        p = (char *)pbVar9;
      }
    }
    if (bVar10) {
      return local_48;
    }
  } while( true );
  while( true ) {
    uVar4 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar4;
    lVar2 = *ppVar8;
    ppVar8 = ppVar8 + -2;
    if (lVar2 == -1) break;
    if ((int)uVar7 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      break;
    }
  }
  ms->capture[(int)uVar4].len = (long)s - (long)ms->capture[(int)uVar4].init;
  pcVar6 = match(ms,s,(char *)((byte *)p + 1));
  if (pcVar6 == (char *)0x0) {
    ms->capture[(int)uVar4].len = -1;
  }
  return pcVar6;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
    case '(': {  /* start capture */
      if (*(p+1) == ')')  /* position capture? */
        return start_capture(ms, s, p+2, CAP_POSITION);
      else
        return start_capture(ms, s, p+1, CAP_UNFINISHED);
    }
    case ')': {  /* end capture */
      return end_capture(ms, s, p+1);
    }
    case L_ESC: {
      switch (*(p+1)) {
        case 'b': {  /* balanced string? */
          s = matchbalance(ms, s, p+2);
          if (s == NULL) return NULL;
          p+=4; goto init;  /* else return match(ms, s, p+4); */
        }
        case 'f': {  /* frontier? */
          const char *ep; char previous;
          p += 2;
          if (*p != '[')
            luaL_error(ms->L, "missing " LUA_QL("[") " after "
                               LUA_QL("%%f") " in pattern");
          ep = classend(ms, p);  /* points to what is next */
          previous = (s == ms->src_init) ? '\0' : *(s-1);
          if (matchbracketclass(uchar(previous), p, ep-1) ||
             !matchbracketclass(uchar(*s), p, ep-1)) return NULL;
          p=ep; goto init;  /* else return match(ms, s, ep); */
        }
        default: {
          if (isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p+1)));
            if (s == NULL) return NULL;
            p+=2; goto init;  /* else return match(ms, s, p+2) */
          }
          goto dflt;  /* case default */
        }
      }
    }
    case '\0': {  /* end of pattern */
      return s;  /* match succeeded */
    }
    case '$': {
      if (*(p+1) == '\0')  /* is the `$' the last char in pattern? */
        return (s == ms->src_end) ? s : NULL;  /* check end of string */
      else goto dflt;
    }
    default: dflt: {  /* it is a pattern item */
      const char *ep = classend(ms, p);  /* points to what is next */
      int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
      switch (*ep) {
        case '?': {  /* optional */
          const char *res;
          if (m && ((res=match(ms, s+1, ep+1)) != NULL))
            return res;
          p=ep+1; goto init;  /* else return match(ms, s, ep+1); */
        }
        case '*': {  /* 0 or more repetitions */
          return max_expand(ms, s, p, ep);
        }
        case '+': {  /* 1 or more repetitions */
          return (m ? max_expand(ms, s+1, p, ep) : NULL);
        }
        case '-': {  /* 0 or more repetitions (minimum) */
          return min_expand(ms, s, p, ep);
        }
        default: {
          if (!m) return NULL;
          s++; p=ep; goto init;  /* else return match(ms, s+1, ep); */
        }
      }
    }
  }
}